

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

CaseDefinition *
vkt::pipeline::anon_unknown_0::makeArrayCompositeCaseDefinition
          (CaseDefinition *__return_storage_ptr__,DataType elemType,int size1,int size2)

{
  undefined4 size2_00;
  int elemType_00;
  DataType type;
  int iVar1;
  deUint32 dVar2;
  char *pcVar3;
  ostream *poVar4;
  FeatureFlags FVar5;
  DataType local_510;
  int local_48c;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  allocator<char> local_3d9;
  string local_3d8;
  SpecConstant local_3b8;
  undefined1 local_37a;
  allocator<char> local_379;
  undefined1 local_378 [8];
  string accumType;
  string caseName;
  int specValue;
  bool isBoolData;
  DataType scalarType;
  string local_308;
  int local_2e4;
  ostringstream local_2e0 [4];
  int combNdx;
  ostringstream globalCode;
  allocator<char> local_161;
  undefined1 local_160 [8];
  string elemTypeName;
  int numCombinations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string arraySizeDecl;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string varName;
  int iStack_18;
  bool isArrayOfArray;
  int size2_local;
  int size1_local;
  DataType elemType_local;
  CaseDefinition *def;
  
  varName.field_2._M_local_buf[0xb] = 0 < size2;
  varName.field_2._12_4_ = size2;
  iStack_18 = size1;
  size2_local = elemType;
  _size1_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"a",&local_41);
  std::allocator<char>::~allocator(&local_41);
  de::toString<int>(&local_d8,&stack0xffffffffffffffe8);
  std::operator+(&local_b8,"[",&local_d8);
  std::operator+(&local_98,&local_b8,"]");
  elemTypeName.field_2._M_local_buf[0xf] = '\0';
  elemTypeName.field_2._M_local_buf[0xe] = '\0';
  elemTypeName.field_2._M_local_buf[0xc] = '\0';
  if ((varName.field_2._M_local_buf[0xb] & 1U) == 0) {
    std::allocator<char>::allocator();
    elemTypeName.field_2._M_local_buf[0xc] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"",(allocator<char> *)(elemTypeName.field_2._M_local_buf + 0xd));
  }
  else {
    de::toString<int>((string *)&numCombinations,(int *)(varName.field_2._M_local_buf + 0xc));
    elemTypeName.field_2._M_local_buf[0xf] = '\x01';
    std::operator+(&local_118,"[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &numCombinations);
    elemTypeName.field_2._M_local_buf[0xe] = '\x01';
    std::operator+(&local_f8,&local_118,"]");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_98,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if ((elemTypeName.field_2._M_local_buf[0xc] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(elemTypeName.field_2._M_local_buf + 0xd));
  }
  if ((elemTypeName.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_118);
  }
  if ((elemTypeName.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&numCombinations);
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  if ((varName.field_2._M_local_buf[0xb] & 1U) == 0) {
    local_48c = iStack_18;
  }
  else {
    local_48c = iStack_18 * varName.field_2._12_4_;
  }
  elemTypeName.field_2._8_4_ = local_48c;
  pcVar3 = glu::getDataTypeName(size2_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_160,pcVar3,&local_161);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::ostringstream::ostringstream(local_2e0);
  for (local_2e4 = 0; local_2e4 < (int)elemTypeName.field_2._8_4_; local_2e4 = local_2e4 + 1) {
    poVar4 = std::operator<<((ostream *)local_2e0,(string *)local_160);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)local_40);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2e4);
    poVar4 = std::operator<<(poVar4,(string *)local_78);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,(string *)local_160);
    poVar4 = std::operator<<(poVar4,(string *)local_78);
    poVar4 = std::operator<<(poVar4,"(");
    elemType_00 = size2_local;
    iVar1 = iStack_18;
    size2_00 = varName.field_2._12_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scalarType,"sc0",(allocator<char> *)&isBoolData);
    composite_case_internal::generateArrayConstructorString
              (&local_308,elemType_00,iVar1,size2_00,(string *)&scalarType,local_2e4);
    poVar4 = std::operator<<(poVar4,(string *)&local_308);
    std::operator<<(poVar4,");\n");
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&scalarType);
    std::allocator<char>::~allocator((allocator<char> *)&isBoolData);
  }
  type = glu::getDataTypeScalarType(size2_local);
  iVar1 = 0x13;
  if (type == TYPE_BOOL) {
    iVar1 = 0;
  }
  pcVar3 = "";
  if ((varName.field_2._M_local_buf[0xb] & 1U) != 0) {
    pcVar3 = "array_";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&accumType.field_2 + 8),pcVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
  local_510 = type;
  if (type == TYPE_BOOL) {
    local_510 = TYPE_INT;
  }
  pcVar3 = glu::getDataTypeName(local_510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_378,pcVar3,&local_379);
  std::allocator<char>::~allocator(&local_379);
  local_37a = 0;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)(accumType.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"sc0",&local_3d9);
  composite_case_internal::makeSpecConstant(&local_3b8,&local_3d8,1,type,iVar1);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            (&__return_storage_ptr__->specConstants,&local_3b8);
  dVar2 = composite_case_internal::getDataTypeScalarSizeBytes(size2_local);
  __return_storage_ptr__->ssboSize = (ulong)(dVar2 * elemTypeName.field_2._8_4_);
  std::operator+(&local_440,"    ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378);
  std::operator+(&local_420,&local_440," result[");
  de::toString<int>(&local_460,(int *)(elemTypeName.field_2._M_local_buf + 8));
  std::operator+(&local_400,&local_420,&local_460);
  std::operator+(&__return_storage_ptr__->ssboCode,&local_400,"];\n");
  std::__cxx11::ostringstream::str();
  composite_case_internal::generateShaderChecksumComputationCode
            (&__return_storage_ptr__->mainCode,size2_local,(string *)local_40,(string *)local_378,
             iStack_18,varName.field_2._12_4_,elemTypeName.field_2._8_4_);
  composite_case_internal::computeExpectedValues
            (&__return_storage_ptr__->expectedValues,iVar1,type,elemTypeName.field_2._8_4_);
  FVar5 = 0;
  if (type == TYPE_DOUBLE) {
    FVar5 = 4;
  }
  __return_storage_ptr__->requirements = FVar5;
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  SpecConstant::~SpecConstant(&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  local_37a = 1;
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)(accumType.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_2e0);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

CaseDefinition makeArrayCompositeCaseDefinition (const glu::DataType elemType, const int size1, const int size2 = 0)
{
	using namespace composite_case_internal;

	DE_ASSERT(size1 > 0);

	const bool        isArrayOfArray  = (size2 > 0);
	const std::string varName		  = "a";
	const std::string arraySizeDecl   = "[" + de::toString(size1) + "]" + (isArrayOfArray ? "[" + de::toString(size2) + "]" : "");
	const int         numCombinations = (isArrayOfArray ? size1 * size2 : size1);
	const std::string elemTypeName    (glu::getDataTypeName(elemType));

	std::ostringstream globalCode;
	{
		// Create several arrays with specialization constant inserted in different positions.
		for (int combNdx = 0; combNdx < numCombinations; ++combNdx)
			globalCode << elemTypeName << " " << varName << combNdx << arraySizeDecl << " = "
					   << elemTypeName << arraySizeDecl << "(" << generateArrayConstructorString(elemType, size1, size2, "sc0", combNdx) << ");\n";
	}

	const glu::DataType scalarType = glu::getDataTypeScalarType(elemType);
	const bool          isBoolData = (scalarType == glu::TYPE_BOOL);
	const int           specValue  = (isBoolData ? 0 : 19);
	const std::string   caseName   = (isArrayOfArray ? "array_" : "") + elemTypeName;
	const std::string   accumType  = (glu::getDataTypeName(isBoolData ? glu::TYPE_INT : scalarType));

	const CaseDefinition def =
	{
		caseName,
		makeVector(makeSpecConstant("sc0", 1u, scalarType, specValue)),
		static_cast<VkDeviceSize>(getDataTypeScalarSizeBytes(elemType) * numCombinations),
		"    " + accumType + " result[" + de::toString(numCombinations) + "];\n",
		globalCode.str(),
		generateShaderChecksumComputationCode(elemType, varName, accumType, size1, size2, numCombinations),
		computeExpectedValues(specValue, scalarType, numCombinations),
		(scalarType == glu::TYPE_DOUBLE ? (FeatureFlags)FEATURE_SHADER_FLOAT_64 : (FeatureFlags)0),
	};
	return def;
}